

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O1

string * __thiscall
TextBuffer::get_dot_graph_abi_cxx11_(string *__return_storage_ptr__,TextBuffer *this)

{
  Layer *pLVar1;
  string *psVar2;
  ostream *poVar3;
  long lVar4;
  iterator iVar5;
  vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> layers;
  Layer *layer;
  stringstream result;
  Layer **local_218;
  iterator iStack_210;
  Layer **local_208;
  Layer *local_1f8;
  string local_1f0;
  string *local_1d0;
  Layer **local_1c8;
  TextBuffer *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8 = this->top_layer;
  local_218 = (Layer **)0x0;
  iStack_210._M_current = (Layer **)0x0;
  local_208 = (Layer **)0x0;
  local_1c0 = this;
  if (local_1f8 != (Layer *)0x0) {
    do {
      if (iStack_210._M_current == local_208) {
        std::vector<TextBuffer::Layer*,std::allocator<TextBuffer::Layer*>>::
        _M_realloc_insert<TextBuffer::Layer*const&>
                  ((vector<TextBuffer::Layer*,std::allocator<TextBuffer::Layer*>> *)&local_218,
                   iStack_210,&local_1f8);
      }
      else {
        *iStack_210._M_current = local_1f8;
        iStack_210._M_current = iStack_210._M_current + 1;
      }
      local_1f8 = local_1f8->previous_layer;
    } while (local_1f8 != (Layer *)0x0);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"graph { label=\"--- buffer ---\" }\n",0x21);
  local_1c8 = local_218;
  local_1d0 = __return_storage_ptr__;
  if (iStack_210._M_current != local_218) {
    lVar4 = 0;
    iVar5._M_current = iStack_210._M_current;
    do {
      pLVar1 = iVar5._M_current[-1];
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"graph { label=\"layer ",0x15);
      poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (snapshot count ",0x11);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      if (pLVar1 == local_1c0->base_layer) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", base",6);
      }
      if (pLVar1->uses_patch == true) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", uses_patch",0xc);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"):\" }\n",6);
      if ((pLVar1->text).is_some == true) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"graph { label=\"text:\n",0x15)
        ;
        poVar3 = operator<<(local_1a8,&(pLVar1->text).value);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" }\n",4);
      }
      if (0 < lVar4 >> 3) {
        Patch::get_dot_graph_abi_cxx11_(&local_1f0,&pLVar1->patch);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      iVar5._M_current = iVar5._M_current + -1;
      lVar4 = lVar4 + 8;
    } while (iVar5._M_current != local_1c8);
  }
  psVar2 = local_1d0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_218 != (Layer **)0x0) {
    operator_delete(local_218,(long)local_208 - (long)local_218);
  }
  return psVar2;
}

Assistant:

string TextBuffer::get_dot_graph() const {
  Layer *layer = top_layer;
  vector<Layer *> layers;
  while (layer) {
    layers.push_back(layer);
    layer = layer->previous_layer;
  }

  std::stringstream result;
  result << "graph { label=\"--- buffer ---\" }\n";
  for (auto begin = layers.rbegin(), iter = begin, end = layers.rend();
       iter != end; ++iter) {
    auto layer = *iter;
    auto index = iter - begin;
    result << "graph { label=\"layer " << index << " (snapshot count " << layer->snapshot_count;
    if (layer == base_layer) result << ", base";
    if (layer->uses_patch) result << ", uses_patch";
    result << "):\" }\n";
    if (layer->text) result << "graph { label=\"text:\n" << *layer->text << "\" }\n";
    if (index > 0) result << layer->patch.get_dot_graph();
  }
  return result.str();
}